

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable-common.h
# Opt level: O3

bool google::sparsehash_internal::read_bigendian_number<StringIO,unsigned_short>
               (StringIO *fp,unsigned_short *value,size_t length)

{
  string *psVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  uchar byte;
  byte local_41;
  ulong local_40;
  ushort *local_38;
  
  *value = 0;
  if (length == 0) {
    bVar6 = true;
  }
  else {
    psVar1 = fp->s_;
    sVar2 = psVar1->_M_string_length;
    local_40 = length;
    local_38 = value;
    memcpy(&local_41,(psVar1->_M_dataplus)._M_p,(ulong)(sVar2 != 0));
    bVar6 = false;
    std::__cxx11::string::erase((ulong)psVar1,0);
    if (sVar2 != 0) {
      iVar5 = (int)local_40 * 8;
      uVar3 = 1;
      do {
        uVar4 = uVar3;
        iVar5 = iVar5 + -8;
        *local_38 = *local_38 | (ushort)local_41 << ((byte)iVar5 & 0x1f);
        if (local_40 == uVar4) break;
        psVar1 = fp->s_;
        sVar2 = psVar1->_M_string_length;
        memcpy(&local_41,(psVar1->_M_dataplus)._M_p,(ulong)(sVar2 != 0));
        std::__cxx11::string::erase((ulong)psVar1,0);
        uVar3 = uVar4 + 1;
      } while (sVar2 != 0);
      bVar6 = local_40 <= uVar4;
    }
  }
  return bVar6;
}

Assistant:

bool read_bigendian_number(INPUT* fp, IntType* value, size_t length) {
  *value = 0;
  unsigned char byte;
  // We require IntType to be unsigned or else the shifting gets all screwy.
  static_assert(static_cast<IntType>(-1) > static_cast<IntType>(0),
                "serializing int requires an unsigned type");
  for (size_t i = 0; i < length; ++i) {
    if (!read_data(fp, &byte, sizeof(byte))) return false;
    *value |= static_cast<IntType>(byte) << ((length - 1 - i) * 8);
  }
  return true;
}